

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O0

void XcmeSelectInput(XcmeContext_s *c)

{
  Display *pDVar1;
  Window WVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  void *pvVar7;
  long lStack_60;
  int found;
  unsigned_long j;
  unsigned_long i;
  unsigned_long n;
  unsigned_long left;
  undefined8 uStack_38;
  int format;
  Atom actual;
  Window *windows;
  unsigned_long nWindow;
  XcmeContext_s *c_local;
  
  windows = (Window *)0x0;
  actual = 0;
  uStack_38 = 0;
  left._4_4_ = 0;
  n = 0;
  pDVar1 = c->display;
  WVar2 = c->root;
  nWindow = (unsigned_long)c;
  uVar5 = XInternAtom(c->display,"_NET_CLIENT_LIST",0);
  XGetWindowProperty(pDVar1,WVar2,uVar5,0,0xffffffffffffffff,0,0x21,&stack0xffffffffffffffc8,
                     (long)&left + 4,&windows,&n,&actual);
  iVar4 = (int)windows + (int)n;
  uVar6 = (ulong)iVar4;
  for (j = 0; j < uVar6; j = j + 1) {
    bVar3 = false;
    for (lStack_60 = 0; (int)lStack_60 < *(int *)(nWindow + 0x38); lStack_60 = lStack_60 + 1) {
      if (*(long *)(actual + j * 8) == *(long *)(*(long *)(nWindow + 0x40) + lStack_60 * 8)) {
        bVar3 = true;
      }
    }
    if ((*(long *)(nWindow + 0x48) != *(long *)(actual + j * 8)) && (!bVar3)) {
      XSelectInput(*(undefined8 *)(nWindow + 0x20),*(undefined8 *)(actual + j * 8),0x408000);
    }
  }
  if (*(int *)(nWindow + 0x38) < iVar4) {
    if (*(long *)(nWindow + 0x40) != 0) {
      free(*(void **)(nWindow + 0x40));
    }
    pvVar7 = malloc(uVar6 << 3);
    *(void **)(nWindow + 0x40) = pvVar7;
  }
  memcpy(*(void **)(nWindow + 0x40),(void *)actual,uVar6 << 3);
  *(int *)(nWindow + 0x38) = iVar4;
  return;
}

Assistant:

void XcmeSelectInput( XcmeContext_s * c )
{
        unsigned long nWindow = 0;
        Window * windows = 0;
  Atom actual = 0;
  int format = 0;
  unsigned long left = 0, n = 0, i,j;

        XGetWindowProperty( c->display, c->root,
          XInternAtom( c->display, "_NET_CLIENT_LIST", False), 0, ~0, False, XA_WINDOW, &actual, &format,
          &nWindow, &left, (unsigned char**)&windows );
        n = (int)(nWindow + left);

        for(i = 0; i < n; ++i)
        {
          /* search of a previous observation of a particular window */
          int found = 0;
          for(j = 0; (int)j < c->nWindows; ++j)
          {
            if(windows[i] == c->Windows[j])
              found = 1;
          }

          /* other new windows but not own */
          if( c->w != windows[i] &&
              !found )
          {
            /* observe other windows */
            XSelectInput( c->display, windows[i],
                       PropertyChangeMask |  /* Xcolor properties */
                       ExposureMask );       /* Xcolor client messages */
          }
        }

        if((int)n > c->nWindows)
        {
          if(c->Windows) free(c->Windows);
          c->Windows = (Window*)malloc( sizeof(Window) * n );
        }
        memcpy( c->Windows, windows, sizeof(Window) * n );
        c->nWindows = n;
}